

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

int impl_ARB1_CompileShader(MOJOSHADER_parseData *pd,GLuint *s)

{
  GLsizei GVar1;
  GLenum GVar2;
  ulong in_RAX;
  GLubyte *pGVar3;
  GLenum GVar4;
  GLuint shader;
  GLint pos;
  undefined8 local_38;
  
  GVar2 = 0x8804;
  if (pd->shader_type != MOJOSHADER_TYPE_PIXEL) {
    GVar2 = 0;
  }
  GVar4 = 0x8620;
  if (pd->shader_type != MOJOSHADER_TYPE_VERTEX) {
    GVar4 = GVar2;
  }
  GVar1 = pd->output_len;
  local_38 = in_RAX & 0xffffffff00000000;
  (*ctx->glGenProgramsARB)(1,(GLuint *)&local_38);
  (*ctx->glGetError)();
  (*ctx->glBindProgramARB)(GVar4,(GLuint)local_38);
  (*ctx->glProgramStringARB)(GVar4,0x8875,GVar1,pd->output);
  GVar2 = (*ctx->glGetError)();
  if (GVar2 != 0x502) {
    *s = (GLuint)local_38;
  }
  else {
    local_38 = local_38 & 0xffffffff;
    (*ctx->glGetIntegerv)(0x864b,(GLint *)((long)&local_38 + 4));
    pGVar3 = (*ctx->glGetString)(0x8874);
    snprintf(error_buffer,0x400,"ARB1 compile error at position %d: %s",local_38 >> 0x20,pGVar3);
    (*ctx->glBindProgramARB)(GVar4,0);
    (*ctx->glDeleteProgramsARB)(1,(GLuint *)&local_38);
    *s = 0;
  }
  return (uint)(GVar2 != 0x502);
}

Assistant:

static int impl_ARB1_CompileShader(const MOJOSHADER_parseData *pd, GLuint *s)
{
    GLint shaderlen = (GLint) pd->output_len;
    const GLenum shader_type = arb1_shader_type(pd->shader_type);
    GLuint shader = 0;
    ctx->glGenProgramsARB(1, &shader);

    ctx->glGetError();  // flush any existing error state.
    ctx->glBindProgramARB(shader_type, shader);
    ctx->glProgramStringARB(shader_type, GL_PROGRAM_FORMAT_ASCII_ARB,
                                shaderlen, pd->output);

    if (ctx->glGetError() == GL_INVALID_OPERATION)
    { 
        GLint pos = 0;
        ctx->glGetIntegerv(GL_PROGRAM_ERROR_POSITION_ARB, &pos);
        const GLubyte *errstr = ctx->glGetString(GL_PROGRAM_ERROR_STRING_ARB);
        snprintf(error_buffer, sizeof (error_buffer),
                  "ARB1 compile error at position %d: %s",
                  (int) pos, (const char *) errstr);
        ctx->glBindProgramARB(shader_type, 0);
        ctx->glDeleteProgramsARB(1, &shader);
        *s = 0;
        return 0;
    } // if

    *s = shader;
    return 1;
}